

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gls::MixedRelinkHoleAttributeTest::iterate(MixedRelinkHoleAttributeTest *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  int iVar10;
  deUint32 layoutLocation;
  uint uVar11;
  string local_310;
  deUint32 local_2ec;
  long *local_2e8 [2];
  long local_2d8 [2];
  Attribute local_2c8;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  AttribType vec4;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  preLinkBindings;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  postLinkBindings;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  ostringstream s;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2ec = anon_unknown_1::getMaxAttributeLocations(this->m_renderCtx);
  puVar2 = &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&s,"vec4","");
  vec4.m_name._M_dataplus._M_p = (pointer)&vec4.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&vec4,
             s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
             s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
             (long)s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream);
  vec4.m_locationSize = 1;
  vec4.m_glTypeEnum = 0x8b52;
  if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar2) {
    operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  iVar10 = 1;
  if (this->m_arraySize != -1) {
    iVar10 = this->m_arraySize;
  }
  preLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  preLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  preLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  postLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  postLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  postLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"a_0","");
  puVar1 = (undefined1 *)((long)&local_2c8.m_type.m_name.field_2 + 8);
  local_2c8.m_type.m_name._M_dataplus._M_p._0_1_ = 1;
  local_2c8.m_type.m_name.field_2._8_8_ = 0x737961776c615f5f;
  local_2c8.m_type.m_name.field_2._M_allocated_capacity = 10;
  local_2c8.m_type.m_locationSize = CONCAT13(local_2c8.m_type.m_locationSize._3_1_,0x5f5f);
  local_2c8.m_type.m_name._M_string_length = (size_type)puVar1;
  AttributeLocationTestUtil::Attribute::Attribute
            ((Attribute *)&s,&vec4,&local_310,-1,(Cond *)&local_2c8,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,(Attribute *)&s);
  puVar3 = &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x68;
  if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._88_8_ != puVar3) {
    operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._88_8_,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._104_8_ + 1);
  }
  puVar4 = &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x38;
  if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != puVar4) {
    operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ + 1);
  }
  if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar2) {
    operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if ((undefined1 *)local_2c8.m_type.m_name._M_string_length != puVar1) {
    operator_delete((void *)local_2c8.m_type.m_name._M_string_length,
                    local_2c8.m_type.m_name.field_2._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_2c8.m_type.m_name._M_dataplus._M_p = (pointer)&local_2c8.m_type.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"a_0","");
  s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)puVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&s,local_2c8.m_type.m_name._M_dataplus._M_p,
             (undefined1 *)
             (local_2c8.m_type.m_name._M_string_length +
             (long)local_2c8.m_type.m_name._M_dataplus._M_p));
  s.super_basic_ostream<char,_std::char_traits<char>_>._32_4_ = 0;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&preLinkBindings,(Bind *)&s);
  if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar2) {
    operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_type.m_name._M_dataplus._M_p != &local_2c8.m_type.m_name.field_2) {
    operator_delete(local_2c8.m_type.m_name._M_dataplus._M_p,
                    local_2c8.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"a_1","");
  local_2c8.m_type.m_name._M_dataplus._M_p._0_1_ = 1;
  local_2c8.m_type.m_name.field_2._8_8_ = 0x737961776c615f5f;
  local_2c8.m_type.m_name.field_2._M_allocated_capacity = 10;
  local_2c8.m_type.m_locationSize = CONCAT13(local_2c8.m_type.m_locationSize._3_1_,0x5f5f);
  local_2c8.m_type.m_name._M_string_length = (size_type)puVar1;
  AttributeLocationTestUtil::Attribute::Attribute
            ((Attribute *)&s,&this->m_type,&local_310,-1,(Cond *)&local_2c8,this->m_arraySize);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,(Attribute *)&s);
  if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._88_8_ != puVar3) {
    operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._88_8_,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._104_8_ + 1);
  }
  if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != puVar4) {
    operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ + 1);
  }
  if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar2) {
    operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if ((undefined1 *)local_2c8.m_type.m_name._M_string_length != puVar1) {
    operator_delete((void *)local_2c8.m_type.m_name._M_string_length,
                    local_2c8.m_type.m_name.field_2._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  layoutLocation = iVar10 * (this->m_type).m_locationSize + 1;
  if ((int)layoutLocation < (int)local_2ec) {
    puVar2 = &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18;
    uVar11 = 2;
    do {
      if ((uVar11 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((Cond *)&s,uVar11);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base
                  ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_2e8,0,(char *)0x0,0x1caf620);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_310.field_2._M_allocated_capacity = *psVar7;
          local_310.field_2._8_8_ = plVar5[3];
        }
        else {
          local_310.field_2._M_allocated_capacity = *psVar7;
          local_310._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_310._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             CONCAT71(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._1_7_
                      ,1);
        s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0x737961776c615f5f;
        s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 10;
        s.super_basic_ostream<char,_std::char_traits<char>_>._32_3_ = 0x5f5f;
        s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = puVar2;
        AttributeLocationTestUtil::Attribute::Attribute
                  (&local_2c8,&vec4,&local_310,-1,(Cond *)&s,-1);
        std::
        vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
        ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_2c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_cond.m_name._M_dataplus._M_p != &local_2c8.m_cond.m_name.field_2) {
          operator_delete(local_2c8.m_cond.m_name._M_dataplus._M_p,
                          local_2c8.m_cond.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_name._M_dataplus._M_p != &local_2c8.m_name.field_2) {
          operator_delete(local_2c8.m_name._M_dataplus._M_p,
                          local_2c8.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_type.m_name._M_dataplus._M_p != &local_2c8.m_type.m_name.field_2) {
          operator_delete(local_2c8.m_type.m_name._M_dataplus._M_p,
                          local_2c8.m_type.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != puVar2) {
          operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                          s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if (local_2e8[0] != local_2d8) {
          operator_delete(local_2e8[0],local_2d8[0] + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((Cond *)&s,uVar11);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base
                  ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)local_2e8,0,(char *)0x0,0x1caf620);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_310.field_2._M_allocated_capacity = *psVar7;
          local_310.field_2._8_8_ = puVar6[3];
        }
        else {
          local_310.field_2._M_allocated_capacity = *psVar7;
          local_310._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_310._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        local_2c8.m_type.m_name._M_dataplus._M_p = (pointer)&local_2c8.m_type.m_name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c8,local_310._M_dataplus._M_p,
                   local_310._M_dataplus._M_p + local_310._M_string_length);
        local_2c8.m_type.m_locationSize = layoutLocation;
        std::
        vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
        ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>
                  (&preLinkBindings,(Bind *)&local_2c8);
        uVar8 = local_2c8.m_type.m_name.field_2._M_allocated_capacity;
        _Var9._M_p = local_2c8.m_type.m_name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_type.m_name._M_dataplus._M_p != &local_2c8.m_type.m_name.field_2) {
LAB_0188d4d7:
          operator_delete(_Var9._M_p,uVar8 + 1);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((Cond *)&s,uVar11);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base
                  ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_2e8,0,(char *)0x0,0x1caf620);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_310.field_2._M_allocated_capacity = *psVar7;
          local_310.field_2._8_8_ = plVar5[3];
        }
        else {
          local_310.field_2._M_allocated_capacity = *psVar7;
          local_310._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_310._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             CONCAT71(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._1_7_
                      ,1);
        s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0x737961776c615f5f;
        s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 10;
        s.super_basic_ostream<char,_std::char_traits<char>_>._32_3_ = 0x5f5f;
        s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = puVar2;
        AttributeLocationTestUtil::Attribute::Attribute
                  (&local_2c8,&vec4,&local_310,layoutLocation,(Cond *)&s,-1);
        std::
        vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
        ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_2c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_cond.m_name._M_dataplus._M_p != &local_2c8.m_cond.m_name.field_2) {
          operator_delete(local_2c8.m_cond.m_name._M_dataplus._M_p,
                          local_2c8.m_cond.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_name._M_dataplus._M_p != &local_2c8.m_name.field_2) {
          operator_delete(local_2c8.m_name._M_dataplus._M_p,
                          local_2c8.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_type.m_name._M_dataplus._M_p != &local_2c8.m_type.m_name.field_2) {
          operator_delete(local_2c8.m_type.m_name._M_dataplus._M_p,
                          local_2c8.m_type.m_name.field_2._M_allocated_capacity + 1);
        }
        uVar8 = s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
        _Var9._M_p = (pointer)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
        if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != puVar2)
        goto LAB_0188d4d7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if (local_2e8[0] != local_2d8) {
        operator_delete(local_2e8[0],local_2d8[0] + 1);
      }
      uVar11 = uVar11 + 1;
      layoutLocation = layoutLocation + 1;
    } while (local_2ec != layoutLocation);
  }
  local_2c8.m_type.m_name._M_dataplus._M_p = (pointer)&local_2c8.m_type.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"a_2","");
  puVar2 = &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)puVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&s,local_2c8.m_type.m_name._M_dataplus._M_p,
             (undefined1 *)
             (local_2c8.m_type.m_name._M_string_length +
             (long)local_2c8.m_type.m_name._M_dataplus._M_p));
  s.super_basic_ostream<char,_std::char_traits<char>_>._32_4_ = 1;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&postLinkBindings,(Bind *)&s);
  if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar2) {
    operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_type.m_name._M_dataplus._M_p != &local_2c8.m_type.m_name.field_2) {
    operator_delete(local_2c8.m_type.m_name._M_dataplus._M_p,
                    local_2c8.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x0;
  s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
  AttributeLocationTestUtil::runTest
            ((this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,&attributes,
             &noBindings,&preLinkBindings,&postLinkBindings,true,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&s);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&s);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&postLinkBindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&preLinkBindings);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vec4.m_name._M_dataplus._M_p != &vec4.m_name.field_2) {
    operator_delete(vec4.m_name._M_dataplus._M_p,vec4.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult MixedRelinkHoleAttributeTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const deInt32		maxAttributes		= getMaxAttributeLocations(m_renderCtx);
	const AttribType	vec4				("vec4", 1, GL_FLOAT_VEC4);
	const int			arrayElementCount	= (m_arraySize != Attribute::NOT_ARRAY ? m_arraySize : 1);

	vector<Bind>		preLinkBindings;
	vector<Bind>		postLinkBindings;
	vector<Attribute>	attributes;
	int					ndx;

	attributes.push_back(Attribute(vec4, "a_0"));
	preLinkBindings.push_back(Bind("a_0", 0));

	attributes.push_back(Attribute(m_type, "a_1", Attribute::LOC_UNDEF, Cond::COND_ALWAYS, m_arraySize));

	ndx = 2;
	for (int loc = 1 + m_type.getLocationSize() * arrayElementCount; loc < maxAttributes; loc++)
	{
		if ((ndx % 2) != 0)
			attributes.push_back(Attribute(vec4, "a_" + de::toString(ndx), loc));
		else
		{
			attributes.push_back(Attribute(vec4, "a_" + de::toString(ndx)));
			preLinkBindings.push_back(Bind("a_" + de::toString(ndx), loc));

		}
		ndx++;
	}

	postLinkBindings.push_back(Bind("a_2", 1));

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, preLinkBindings, postLinkBindings, true);
	return STOP;
}